

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Matchers::StdString::EndsWithMatcher::EndsWithMatcher
          (EndsWithMatcher *this,CasedString *comparator)

{
  allocator<char> local_39;
  string local_38;
  CasedString *local_18;
  CasedString *comparator_local;
  EndsWithMatcher *this_local;
  
  local_18 = comparator;
  comparator_local = (CasedString *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"ends with",&local_39);
  StringMatcherBase::StringMatcherBase(&this->super_StringMatcherBase,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  (this->super_StringMatcherBase).
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_MatcherUntypedBase._vptr_MatcherUntypedBase = (_func_int **)&PTR__EndsWithMatcher_00288b98;
  (this->super_StringMatcherBase).
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MatcherMethod = (_func_int **)&DAT_00288bc8;
  return;
}

Assistant:

EndsWithMatcher::EndsWithMatcher( CasedString const& comparator ) : StringMatcherBase( "ends with", comparator ) {}